

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O1

void emtlini(emtcxdef *ctx)

{
  int iVar1;
  emtldef *peVar2;
  int iVar3;
  
  iVar1 = ctx->emtcxlcnt;
  peVar2 = ctx->emtcxlbl;
  if (1 < iVar1) {
    iVar3 = 1;
    do {
      peVar2->emtllnk = (ushort)iVar3;
      peVar2 = peVar2 + 1;
      iVar3 = iVar3 + 1;
    } while (iVar1 != iVar3);
  }
  peVar2->emtllnk = 0xffff;
  ctx->emtcxlfre = 0;
  return;
}

Assistant:

void emtlini(emtcxdef *ctx)
{
    int      i;
    emtldef *p;
    int      max;
    
    for (max = ctx->emtcxlcnt, i = 1, p = ctx->emtcxlbl ; i < max ; ++p, ++i)
        p->emtllnk = i;
    p->emtllnk = EMTLLNKEND;
    ctx->emtcxlfre = 0;
}